

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void do_knife(CHAR_DATA *ch,char *argument)

{
  undefined2 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *victim;
  char *pcVar5;
  short sVar6;
  char *pcVar7;
  long lVar8;
  AFFECT_DATA af;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  iVar3 = get_skill(ch,(int)gsn_knife);
  if (iVar3 == 0) {
LAB_0034debe:
    bVar2 = is_npc(ch);
    if (!bVar2) {
      pcVar7 = "You don\'t know how to knife.\n\r";
      goto LAB_0034def1;
    }
  }
  else {
    sVar6 = ch->level;
    lVar8 = (long)gsn_knife;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (sVar6 < *(short *)(lVar8 * 0x60 + 0x44e788 + (long)iVar3 * 2)) goto LAB_0034debe;
  }
  if (arg[0] == '\0') {
    pcVar7 = "Knife whom?\n\r";
LAB_0034def1:
    send_to_char(pcVar7,ch);
    return;
  }
  if (ch->fighting != (CHAR_DATA *)0x0) {
    pcVar7 = "No way! You\'re still fighting!\n\r";
    goto LAB_0034def1;
  }
  victim = get_char_room(ch,arg);
  if (victim == (CHAR_DATA *)0x0) {
    pcVar7 = "They aren\'t here.\n\r";
    goto LAB_0034def1;
  }
  if (victim == ch) {
    pcVar7 = "Bah, you can\'t knife yourself.\n\r";
    goto LAB_0034def1;
  }
  bVar2 = is_wielded(ch,2,1);
  if (!bVar2) {
    pcVar7 = "You need to be wielding a dagger to knife.\n\r";
    goto LAB_0034def1;
  }
  bVar2 = is_safe(ch,victim);
  if (bVar2) {
    return;
  }
  WAIT_STATE(ch,0xc);
  bVar2 = is_npc(ch);
  if ((bVar2) || (bVar2 = is_npc(victim), bVar2)) goto LAB_0034dfed;
  iVar3 = number_range(0,1);
  if (iVar3 == 0) {
    pcVar7 = "Die, %s you knifing fool!";
LAB_0034dfba:
    pcVar5 = pers(ch,victim);
    sprintf(buf,pcVar7,pcVar5);
  }
  else if (iVar3 == 1) {
    pcVar7 = "Help! %s knifed me!";
    goto LAB_0034dfba;
  }
  do_myell(victim,buf,ch);
LAB_0034dfed:
  iVar3 = number_percent();
  iVar4 = get_skill(ch,(int)gsn_knife);
  if (iVar4 <= iVar3) {
    damage(ch,victim,0,(int)gsn_knife,0,true);
    check_improve(ch,(int)gsn_knife,false,2);
    return;
  }
  act("You slam your dagger into $N\'s side!",ch,(void *)0x0,victim,3);
  act("$n slams $s dagger into your side!",ch,(void *)0x0,victim,2);
  act("$n slams $s dagger into $N\'s side!",ch,(void *)0x0,victim,1);
  iVar3 = one_hit_new(ch,victim,(int)gsn_knife,true,false,0,0x7d,(char *)0x0);
  check_improve(ch,(int)gsn_knife,true,1);
  if (iVar3 != 0) {
    return;
  }
  iVar3 = number_range(0,5);
  if (iVar3 != 3) {
    return;
  }
  act("Bright red blood spurts out of $S wound!\n\r",ch,(void *)0x0,victim,3);
  init_affect(&af);
  af.where = 0;
  uVar1 = ch->level;
  sVar6 = uVar1 + 7;
  if (-1 < (short)uVar1) {
    sVar6 = uVar1;
  }
  af.duration = (short)((uint)(int)sVar6 >> 3);
  af.type = gsn_bleeding;
  af.modifier = 0;
  af.aftype = 5;
  af.tick_fun = bleeding_tick;
  af.owner = ch;
  af.level = uVar1;
  new_affect_to_char(victim,&af);
  return;
}

Assistant:

void do_knife(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];
	AFFECT_DATA af;

	one_argument(argument, arg);

	if ((get_skill(ch, gsn_knife) == 0) || ch->level < skill_table[gsn_knife].skill_level[ch->Class()->GetIndex()])
	{
		if (!is_npc(ch))
		{
			send_to_char("You don't know how to knife.\n\r", ch);
			return;
		}
	}

	if (arg[0] == '\0')
	{
		send_to_char("Knife whom?\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("No way! You're still fighting!\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Bah, you can't knife yourself.\n\r", ch);
		return;
	}

	if (!is_wielded(ch, WEAPON_DAGGER, WIELD_ONE))
	{
		send_to_char("You need to be wielding a dagger to knife.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (!is_npc(ch) && !is_npc(victim))
	{
		switch (number_range(0, 1))
		{
			case 0:
				sprintf(buf, "Die, %s you knifing fool!", pers(ch, victim));
				break;
			case 1:
				sprintf(buf, "Help! %s knifed me!", pers(ch, victim));
				break;
		}

		do_myell(victim, buf, ch);
	}

	if (number_percent() < get_skill(ch, gsn_knife))
	{
		act("You slam your dagger into $N's side!", ch, 0, victim, TO_CHAR);
		act("$n slams $s dagger into your side!", ch, 0, victim, TO_VICT);
		act("$n slams $s dagger into $N's side!", ch, 0, victim, TO_NOTVICT);

		bool killed = one_hit_new(ch, victim, gsn_knife, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 125, nullptr);

		check_improve(ch, gsn_knife, true, 1);

		if (killed)
			return;

		if (number_range(0, 5) == 3)
		{
			act("Bright red blood spurts out of $S wound!\n\r", ch, 0, victim, TO_CHAR);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_bleeding;
			af.level = ch->level;
			af.modifier = 0;
			af.aftype = AFT_INVIS;
			af.tick_fun = bleeding_tick;
			af.owner = ch;
			new_affect_to_char(victim, &af);
		}
	}
	else
	{
		damage(ch, victim, 0, gsn_knife, DAM_NONE, true);
		check_improve(ch, gsn_knife, false, 2);
	}
}